

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Dropout_x86_avx::forward_inplace(Dropout_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  uint uVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  undefined1 auVar17 [16];
  float fVar20;
  
  if (*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx[-3]) != 1.0) {
    iVar11 = bottom_top_blob->dims;
    auVar17 = ZEXT416((uint)*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx[-3]));
    if (bottom_top_blob->elempack == 4) {
      uVar2 = bottom_top_blob->w;
      uVar3 = bottom_top_blob->h;
      uVar15 = bottom_top_blob->c;
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      fVar16 = auVar17._0_4_;
      fVar18 = auVar17._4_4_;
      fVar19 = auVar17._8_4_;
      fVar20 = auVar17._12_4_;
      if (iVar11 == 3) {
        if (0 < (int)uVar15) {
          uVar12 = 1;
          if (1 < (int)uVar15) {
            uVar12 = (ulong)uVar15;
          }
          uVar10 = 0;
          do {
            if (0 < (int)(uVar3 * uVar2)) {
              pfVar14 = (float *)(bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar11 = uVar3 * uVar2;
              do {
                *pfVar14 = fVar16 * *pfVar14;
                pfVar14[1] = fVar18 * pfVar14[1];
                pfVar14[2] = fVar19 * pfVar14[2];
                pfVar14[3] = fVar20 * pfVar14[3];
                pfVar14 = pfVar14 + 4;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar12);
        }
      }
      else if (iVar11 == 2) {
        if (0 < (int)uVar3) {
          uVar12 = 0;
          do {
            if (0 < (int)uVar2) {
              pfVar14 = (float *)((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar10 = (ulong)uVar2;
              do {
                *pfVar14 = fVar16 * *pfVar14;
                pfVar14[1] = fVar18 * pfVar14[1];
                pfVar14[2] = fVar19 * pfVar14[2];
                pfVar14[3] = fVar20 * pfVar14[3];
                pfVar14 = pfVar14 + 4;
                uVar15 = (int)uVar10 - 1;
                uVar10 = (ulong)uVar15;
              } while (uVar15 != 0);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar3);
        }
      }
      else if ((iVar11 == 1) && (0 < (int)uVar2)) {
        lVar13 = 0;
        do {
          pfVar14 = (float *)((long)bottom_top_blob->data + lVar13);
          fVar4 = pfVar14[1];
          fVar5 = pfVar14[2];
          fVar6 = pfVar14[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar13);
          *pfVar1 = fVar16 * *pfVar14;
          pfVar1[1] = fVar18 * fVar4;
          pfVar1[2] = fVar19 * fVar5;
          pfVar1[3] = fVar20 * fVar6;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar13);
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        iVar11 = Dropout::forward_inplace
                           ((Dropout *)
                            ((long)&this->_vptr_Dropout_x86_avx +
                            (long)this->_vptr_Dropout_x86_avx[-3]),bottom_top_blob,opt);
        return iVar11;
      }
      uVar2 = bottom_top_blob->w;
      uVar3 = bottom_top_blob->h;
      uVar15 = bottom_top_blob->c;
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      fVar16 = auVar17._0_4_;
      fVar18 = auVar17._4_4_;
      fVar19 = auVar17._8_4_;
      fVar20 = auVar17._12_4_;
      if (iVar11 == 3) {
        if (0 < (int)uVar15) {
          uVar12 = 1;
          if (1 < (int)uVar15) {
            uVar12 = (ulong)uVar15;
          }
          uVar10 = 0;
          do {
            if (0 < (int)(uVar3 * uVar2)) {
              pfVar14 = (float *)(bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar11 = uVar3 * uVar2;
              do {
                *pfVar14 = fVar16 * *pfVar14;
                pfVar14[1] = fVar18 * pfVar14[1];
                pfVar14[2] = fVar19 * pfVar14[2];
                pfVar14[3] = fVar20 * pfVar14[3];
                pfVar14[4] = fVar16 * pfVar14[4];
                pfVar14[5] = fVar18 * pfVar14[5];
                pfVar14[6] = fVar19 * pfVar14[6];
                pfVar14[7] = 0.0;
                pfVar14 = pfVar14 + 8;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar12);
        }
      }
      else if (iVar11 == 2) {
        if (0 < (int)uVar3) {
          uVar12 = 0;
          do {
            if (0 < (int)uVar2) {
              pfVar14 = (float *)((long)bottom_top_blob->w * uVar12 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar10 = (ulong)uVar2;
              do {
                *pfVar14 = fVar16 * *pfVar14;
                pfVar14[1] = fVar18 * pfVar14[1];
                pfVar14[2] = fVar19 * pfVar14[2];
                pfVar14[3] = fVar20 * pfVar14[3];
                pfVar14[4] = fVar16 * pfVar14[4];
                pfVar14[5] = fVar18 * pfVar14[5];
                pfVar14[6] = fVar19 * pfVar14[6];
                pfVar14[7] = 0.0;
                pfVar14 = pfVar14 + 8;
                uVar15 = (int)uVar10 - 1;
                uVar10 = (ulong)uVar15;
              } while (uVar15 != 0);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar3);
        }
      }
      else if ((iVar11 == 1) && (0 < (int)uVar2)) {
        lVar13 = 0;
        do {
          pfVar14 = (float *)((long)bottom_top_blob->data + lVar13);
          fVar4 = pfVar14[1];
          fVar5 = pfVar14[2];
          fVar6 = pfVar14[3];
          fVar7 = pfVar14[4];
          fVar8 = pfVar14[5];
          fVar9 = pfVar14[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar13);
          *pfVar1 = fVar16 * *pfVar14;
          pfVar1[1] = fVar18 * fVar4;
          pfVar1[2] = fVar19 * fVar5;
          pfVar1[3] = fVar20 * fVar6;
          pfVar1[4] = fVar16 * fVar7;
          pfVar1[5] = fVar18 * fVar8;
          pfVar1[6] = fVar19 * fVar9;
          pfVar1[7] = 0.0;
          lVar13 = lVar13 + 0x20;
        } while ((ulong)uVar2 << 5 != lVar13);
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}